

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::recoverFromError(Reader *this,TokenType skipUntilToken)

{
  bool bVar1;
  size_type sVar2;
  undefined1 local_30 [8];
  Token skip;
  int errorCount;
  TokenType skipUntilToken_local;
  Reader *this_local;
  
  skip.end_._4_4_ = skipUntilToken;
  sVar2 = std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::size
                    (&this->errors_);
  skip.end_._0_4_ = (int)sVar2;
  do {
    bVar1 = readToken(this,(Token *)local_30);
    if (!bVar1) {
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
                (&this->errors_,(long)(int)skip.end_);
    }
  } while ((local_30._0_4_ != skip.end_._4_4_) && (local_30._0_4_ != tokenEndOfStream));
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
            (&this->errors_,(long)(int)skip.end_);
  return false;
}

Assistant:

bool 
Reader::recoverFromError( TokenType skipUntilToken )
{
   int errorCount = int(errors_.size());
   Token skip;
   for (;;)
   {
      if ( !readToken(skip) )
         errors_.resize( errorCount ); // discard errors caused by recovery
      if ( skip.type_ == skipUntilToken  ||  skip.type_ == tokenEndOfStream )
         break;
   }
   errors_.resize( errorCount );
   return false;
}